

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smart_ban.cpp
# Opt level: O0

shared_ptr<libtorrent::torrent_plugin>
libtorrent::create_smart_ban_plugin(torrent_handle *th,client_data_t param_2)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<libtorrent::torrent_plugin> sVar2;
  undefined1 local_50 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  torrent *t;
  torrent_handle *th_local;
  client_data_t param_1_local;
  
  th_local = (torrent_handle *)param_2.m_client_ptr;
  t = (torrent *)param_2.m_type_ptr;
  param_1_local.m_client_ptr = th;
  torrent_handle::native_handle((torrent_handle *)(local_50 + 0x10));
  peVar1 = ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                      (local_50 + 0x10));
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)(local_50 + 0x10));
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1;
  ::std::make_shared<libtorrent::(anonymous_namespace)::smart_ban_plugin,libtorrent::aux::torrent&>
            ((torrent *)local_50);
  ::std::shared_ptr<libtorrent::torrent_plugin>::
  shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin,void>
            ((shared_ptr<libtorrent::torrent_plugin> *)th,
             (shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin> *)local_50);
  ::std::shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin>::~shared_ptr
            ((shared_ptr<libtorrent::(anonymous_namespace)::smart_ban_plugin> *)local_50);
  sVar2.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)th;
  return (shared_ptr<libtorrent::torrent_plugin>)
         sVar2.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_plugin> create_smart_ban_plugin(torrent_handle const& th, client_data_t)
	{
		aux::torrent* t = th.native_handle().get();
		return std::make_shared<smart_ban_plugin>(*t);
	}